

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addListeners(Catch *this,Ptr<const_Catch::IConfig> *config,
                   Ptr<Catch::IStreamingReporter> *reporters)

{
  IReporterFactory *pIVar1;
  NonCopyable NVar2;
  Catch *pCVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *__x;
  undefined4 extraout_var_00;
  pointer pPVar6;
  Listeners listeners;
  Ptr<Catch::IStreamingReporter> local_80;
  Catch *local_78;
  Ptr<const_Catch::IConfig> *local_70;
  pointer local_68;
  Catch local_60 [8];
  ReporterConfig local_58;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  local_48;
  
  local_78 = this;
  local_70 = config;
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
  __x = (vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
         *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                     ((long *)CONCAT44(extraout_var,iVar4));
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::vector(&local_48,__x);
  local_68 = local_48.
             super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar6 = local_48.
                super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar3 = local_78, pPVar6 != local_68;
      pPVar6 = pPVar6 + 1) {
    pIVar1 = pPVar6->m_p;
    ReporterConfig::ReporterConfig(&local_58,local_70);
    iVar4 = (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(pIVar1,&local_58);
    local_80.m_p = (IStreamingReporter *)CONCAT44(extraout_var_00,iVar4);
    if (local_80.m_p != (IStreamingReporter *)0x0) {
      (*((local_80.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(local_80.m_p);
    }
    addReporter(local_60,reporters,&local_80);
    Ptr<Catch::IStreamingReporter>::operator=(reporters,(Ptr<Catch::IStreamingReporter> *)local_60);
    Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)local_60);
    Ptr<Catch::IStreamingReporter>::~Ptr(&local_80);
    Ptr<const_Catch::IConfig>::~Ptr(&local_58.m_fullConfig);
  }
  NVar2._vptr_NonCopyable = (_func_int **)reporters->m_p;
  *(_func_int ***)local_78 = NVar2._vptr_NonCopyable;
  if ((NonCopyable)NVar2._vptr_NonCopyable != (NonCopyable)0x0) {
    (**(code **)(*NVar2._vptr_NonCopyable + 0x10))();
  }
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::~vector(&local_48);
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)pCVar3;
}

Assistant:

Ptr<IStreamingReporter> addListeners( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> reporters ) {
        IReporterRegistry::Listeners listeners = getRegistryHub().getReporterRegistry().getListeners();
        for( IReporterRegistry::Listeners::const_iterator it = listeners.begin(), itEnd = listeners.end();
                it != itEnd;
                ++it )
            reporters = addReporter(reporters, (*it)->create( ReporterConfig( config ) ) );
        return reporters;
    }